

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TryAllocFromZeroPagesList
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment,
          BackgroundPageQueue *bgPageQueue,bool isPendingZeroList)

{
  size_t *psVar1;
  undefined4 *puVar2;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  DWORD DVar6;
  FreePageEntry *pFVar7;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  ThreadContextId pvVar8;
  size_t __n;
  uint uVar9;
  FreePageEntry *address;
  ulong uVar10;
  undefined8 *in_FS_OFFSET;
  FreePageEntry *local_48;
  
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    __n = 0x18;
    if (isPendingZeroList) {
      __n = (ulong)(pageCount << 0xc);
    }
    address = (FreePageEntry *)0x0;
    local_48 = (FreePageEntry *)0x0;
    do {
      if (isPendingZeroList) {
        pFVar7 = ZeroPageQueue::PopZeroPageEntry((ZeroPageQueue *)this->backgroundPageQueue);
      }
      else {
        pFVar7 = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
      }
      if (pFVar7 == (FreePageEntry *)0x0) {
        bVar4 = false;
      }
      else if (pFVar7->pageCount == pageCount) {
        *pageSegment = pFVar7->segment;
        bVar4 = false;
        memset(pFVar7,0,__n);
        FillAllocPages(this,pFVar7,pageCount);
        local_48 = pFVar7;
      }
      else {
        if (isPendingZeroList) {
          memset(pFVar7 + 1,0,(ulong)(pFVar7->pageCount << 0xc) - 0x18);
        }
        pFVar7->Next = address;
        bVar4 = true;
        uVar9 = pFVar7->pageCount - pageCount;
        address = pFVar7;
        if (pageCount <= pFVar7->pageCount && uVar9 != 0) {
          *pageSegment = pFVar7->segment;
          pFVar7->pageCount = uVar9;
          local_48 = (FreePageEntry *)((long)&pFVar7->Next + (ulong)(uVar9 * 0x1000));
          FillAllocPages(this,local_48,pageCount);
          bVar4 = false;
        }
      }
    } while (bVar4);
  }
  else {
    address = (FreePageEntry *)0x0;
    local_48 = (FreePageEntry *)0x0;
  }
  if (address != (FreePageEntry *)0x0) {
    uVar5 = 0;
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    do {
      pFVar7 = address->Next;
      segment = address->segment;
      uVar9 = address->pageCount;
      fromSegmentList = GetSegmentList(this,segment);
      if (fromSegmentList ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x3b2,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      address->Next = (FreePageEntry *)0x0;
      address->segment = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
      *(undefined8 *)&address->pageCount = 0;
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages(segment,address,uVar9);
      uVar5 = uVar5 + uVar9;
      TransferSegment(this,segment,fromSegmentList);
      address = pFVar7;
    } while (pFVar7 != (FreePageEntry *)0x0);
    uVar10 = (ulong)uVar5;
    SubUsedBytes(this,uVar10 << 0xc);
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->releasePageCount;
      *psVar1 = *psVar1 + uVar10;
    }
    bVar4 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if ((bVar4) && (this->pageAllocatorFlagTable->Verbose == true)) {
      pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar6 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar6,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"New free pages: %d\n",(ulong)uVar5);
      Output::Print(L"\n");
      Output::Flush();
    }
    UpdateMinFreePageCount(this);
    uVar10 = uVar10 + this->freePageCount;
    this->freePageCount = uVar10;
    if (uVar10 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar10;
    }
  }
  return (char *)local_48;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPagesList(
    uint pageCount, TPageSegment ** pageSegment, BackgroundPageQueue* bgPageQueue, bool isPendingZeroList)
{
    FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);

    char * pages = nullptr;
    FreePageEntry* localList = nullptr;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        while (true)
        {
            FreePageEntry * freePage = isPendingZeroList ? ((ZeroPageQueue *)backgroundPageQueue)->PopZeroPageEntry() : backgroundPageQueue->PopFreePageEntry();
            if (freePage == nullptr)
            {
                break;
            }

            if (freePage->pageCount == pageCount)
            {
                *pageSegment = freePage->segment;
                pages = (char *)freePage;
                memset(pages, 0, isPendingZeroList ? (pageCount*AutoSystemInfo::PageSize) : sizeof(FreePageEntry));
                this->FillAllocPages(pages, pageCount);
                break;
            }
            else
            {
                if (isPendingZeroList)
                {
                    memset((char *)freePage + sizeof(FreePageEntry), 0, (freePage->pageCount*AutoSystemInfo::PageSize) - sizeof(FreePageEntry));
                }

                freePage->Next = localList;
                localList = (FreePageEntry*)freePage;

                if (freePage->pageCount > pageCount)
                {
                    *pageSegment = freePage->segment;
                    freePage->pageCount -= pageCount;
                    pages = (char *)freePage + freePage->pageCount * AutoSystemInfo::PageSize;
                    this->FillAllocPages(pages, pageCount);
                    break;
                }
            }
        }
    }
#endif

    if (localList != nullptr)
    {
        uint newFreePages = 0;
        while (localList != nullptr)
        {
            FreePageEntry* freePagesEntry = localList;
            localList = (FreePageEntry*)localList->Next;

            TPageSegment * segment = freePagesEntry->segment;
            pageCount = freePagesEntry->pageCount;

            DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
            Assert(fromSegmentList != nullptr);

            memset(freePagesEntry, 0, sizeof(FreePageEntry));

            segment->ReleasePages(freePagesEntry, pageCount);
            newFreePages += pageCount;

            TransferSegment(segment, fromSegmentList);

        }

        LogFreePages(newFreePages);
        PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
        this->AddFreePageCount(newFreePages);
#if DBG
        UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
    }

    return pages;
}